

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound_linux_alsa.cpp
# Opt level: O2

void __thiscall
YsSoundPlayer::APISpecificData::PopulateWriteBuffer
          (APISpecificData *this,uint *writeBufFilledInNStep,uint wavPtr,SoundData *wavFile,
          YSBOOL loop,int nThSound)

{
  uint uVar1;
  uchar *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uchar *puVar7;
  uint uVar8;
  uchar uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  
  uVar1 = *writeBufFilledInNStep;
  *writeBufFilledInNStep = 0;
  do {
    uVar6 = *writeBufFilledInNStep;
    if (this->bufSizeInNStep <= uVar6) goto LAB_00113c8e;
    puVar7 = SoundData::DataPointerAtTimeStep(wavFile,wavPtr);
    uVar6 = this->bytePerTimeStep;
    uVar4 = SoundData::SizeInByte(wavFile);
    uVar8 = (this->bufSizeInNStep - *writeBufFilledInNStep) * this->bytePerTimeStep;
    uVar4 = uVar4 - uVar6 * wavPtr;
    if ((int)uVar4 < (int)uVar8) {
      uVar8 = uVar4;
    }
    for (uVar12 = 0; (long)uVar12 <= (long)(int)(uVar8 - 2); uVar12 = uVar12 + 2) {
      uVar6 = *writeBufFilledInNStep;
      uVar4 = this->bytePerTimeStep;
      uVar11 = (uint)uVar12;
      if ((nThSound == 0) || (uVar1 < (int)((uVar12 & 0xffffffff) / (ulong)uVar4) + uVar6)) {
        this->writeBuf[uVar4 * uVar6 + uVar11] = puVar7[uVar12];
        uVar5 = uVar11 + 1;
        uVar9 = puVar7[uVar12 + 1];
      }
      else {
        uVar5 = uVar11 | 1;
        uVar14 = (uint)CONCAT11(puVar7[uVar12 + 1],puVar7[uVar12]);
        uVar3 = uVar14 | 0xffff0000;
        if (-1 < (char)puVar7[uVar12 + 1]) {
          uVar3 = uVar14;
        }
        puVar2 = this->writeBuf;
        uVar13 = uVar11 + uVar4 * uVar6;
        uVar15 = (uint)CONCAT11(puVar2[uVar4 * uVar6 + uVar11 + 1],puVar2[uVar13]);
        uVar14 = uVar15 | 0xffff0000;
        if (-1 < (char)puVar2[uVar4 * uVar6 + uVar11 + 1]) {
          uVar14 = uVar15;
        }
        iVar10 = uVar14 + uVar3;
        if (0x7ffe < iVar10) {
          iVar10 = 0x7fff;
        }
        if (iVar10 < -0x7fff) {
          iVar10 = -0x8000;
        }
        puVar2[uVar13] = (uchar)iVar10;
        uVar9 = (uchar)((uint)iVar10 >> 8);
      }
      this->writeBuf[uVar5 + this->bytePerTimeStep * *writeBufFilledInNStep] = uVar9;
    }
    *writeBufFilledInNStep = *writeBufFilledInNStep + uVar8 / this->bytePerTimeStep;
    uVar8 = uVar8 / this->bytePerTimeStep + wavPtr;
    uVar6 = SoundData::NTimeStep(wavFile);
    wavPtr = uVar8;
    if (loop == YSTRUE) {
      wavPtr = 0;
    }
    if (uVar8 < uVar6) {
      wavPtr = uVar8;
    }
  } while ((loop == YSTRUE) || (uVar8 < uVar6));
  uVar6 = *writeBufFilledInNStep;
LAB_00113c8e:
  if (uVar6 < uVar1) {
    *writeBufFilledInNStep = uVar1;
  }
  return;
}

Assistant:

void YsSoundPlayer::APISpecificData::PopulateWriteBuffer(unsigned int &writeBufFilledInNStep,unsigned int wavPtr,const SoundData *wavFile,YSBOOL loop,int nThSound)
{
	auto currentFilledInNStep=writeBufFilledInNStep;
	writeBufFilledInNStep=0;
	while(writeBufFilledInNStep<bufSizeInNStep)
	{
		const unsigned char *dataPtr=wavFile->DataPointerAtTimeStep(wavPtr);
		const int ptrInByte=wavPtr*bytePerTimeStep;
		const int wavByteLeft=wavFile->SizeInByte()-ptrInByte;
		const int writeBufLeftInByte=(bufSizeInNStep-writeBufFilledInNStep)*bytePerTimeStep;
		
		int nByteToWrite;
		if(wavByteLeft<writeBufLeftInByte)
		{
			nByteToWrite=wavByteLeft;
		}
		else
		{
			nByteToWrite=writeBufLeftInByte;
		}

		for(int i=0; i<=nByteToWrite-2; i+=2)
		{
			if(0==nThSound || currentFilledInNStep<writeBufFilledInNStep+i/bytePerTimeStep)
			{
				writeBuf[writeBufFilledInNStep*bytePerTimeStep+i  ]=dataPtr[i];
				writeBuf[writeBufFilledInNStep*bytePerTimeStep+i+1]=dataPtr[i+1];
			}
			else
			{
				int v=(int)dataPtr[i]+(((int)dataPtr[i+1])<<8);
				if(32768<=v)
				{
					v-=65536;
				}
				int c=  (int)writeBuf[writeBufFilledInNStep*bytePerTimeStep+i]
				     +(((int)writeBuf[writeBufFilledInNStep*bytePerTimeStep+i+1])<<8);
				if(32768<=c)
				{
					c-=65536;
				}
				v+=c;
				if(32767<v)
				{
					v=32767;
				}
				if(v<-32768)
				{
					v=-32768;
				}
				writeBuf[writeBufFilledInNStep*bytePerTimeStep+i  ]=v&0xff;
				writeBuf[writeBufFilledInNStep*bytePerTimeStep+i+1]=((v>>8)&0xff);
			}
		}
		writeBufFilledInNStep+=nByteToWrite/bytePerTimeStep;
		wavPtr+=nByteToWrite/bytePerTimeStep;
		if(wavFile->NTimeStep()<=wavPtr)
		{
			if(YSTRUE!=loop)
			{
				break;
			}
			wavPtr=0;
		}
	}

	if(writeBufFilledInNStep<currentFilledInNStep)
	{
		writeBufFilledInNStep=currentFilledInNStep;
	}
}